

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

void ps_search_base_free(ps_search_t *search)

{
  ckd_free(search->name);
  ckd_free(search->type);
  dict_free(search->dict);
  dict2pid_free(search->d2p);
  ckd_free(search->hyp_str);
  ps_lattice_free(search->dag);
  return;
}

Assistant:

void
ps_search_base_free(ps_search_t *search)
{
    /* FIXME: We will have refcounting on acmod, config, etc, at which
     * point we will free them here too. */
    ckd_free(search->name);
    ckd_free(search->type);
    dict_free(search->dict);
    dict2pid_free(search->d2p);
    ckd_free(search->hyp_str);
    ps_lattice_free(search->dag);
}